

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void clearSelect(sqlite3 *db,Select *p,int bFree)

{
  bool bVar1;
  bool bVar2;
  Select *p_00;
  
  bVar1 = bFree == 0;
  while (p_00 = p, p_00 != (Select *)0x0) {
    p = p_00->pPrior;
    sqlite3ExprListDelete(db,p_00->pEList);
    sqlite3SrcListDelete(db,p_00->pSrc);
    sqlite3ExprDelete(db,p_00->pWhere);
    sqlite3ExprListDelete(db,p_00->pGroupBy);
    sqlite3ExprDelete(db,p_00->pHaving);
    sqlite3ExprListDelete(db,p_00->pOrderBy);
    sqlite3ExprDelete(db,p_00->pLimit);
    if (p_00->pWith != (With *)0x0) {
      sqlite3WithDelete(db,p_00->pWith);
    }
    if (p_00->pWinDefn != (Window *)0x0) {
      sqlite3WindowListDelete(db,p_00->pWinDefn);
    }
    while (p_00->pWin != (Window *)0x0) {
      sqlite3WindowUnlinkFromSelect(p_00->pWin);
    }
    bVar2 = !bVar1;
    bVar1 = false;
    if (bVar2) {
      sqlite3DbFreeNN(db,p_00);
      bVar1 = false;
    }
  }
  return;
}

Assistant:

static void clearSelect(sqlite3 *db, Select *p, int bFree){
  while( p ){
    Select *pPrior = p->pPrior;
    sqlite3ExprListDelete(db, p->pEList);
    sqlite3SrcListDelete(db, p->pSrc);
    sqlite3ExprDelete(db, p->pWhere);
    sqlite3ExprListDelete(db, p->pGroupBy);
    sqlite3ExprDelete(db, p->pHaving);
    sqlite3ExprListDelete(db, p->pOrderBy);
    sqlite3ExprDelete(db, p->pLimit);
    if( OK_IF_ALWAYS_TRUE(p->pWith) ) sqlite3WithDelete(db, p->pWith);
#ifndef SQLITE_OMIT_WINDOWFUNC
    if( OK_IF_ALWAYS_TRUE(p->pWinDefn) ){
      sqlite3WindowListDelete(db, p->pWinDefn);
    }
    while( p->pWin ){
      assert( p->pWin->ppThis==&p->pWin );
      sqlite3WindowUnlinkFromSelect(p->pWin);
    }
#endif
    if( bFree ) sqlite3DbFreeNN(db, p);
    p = pPrior;
    bFree = 1;
  }
}